

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall QHttpNetworkConnectionChannel::allDone(QHttpNetworkConnectionChannel *this)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  ConnectionType CVar4;
  SocketState SVar5;
  QHttpNetworkConnectionChannel *obj;
  QHttpNetworkConnectionPrivate *pQVar6;
  QHttpNetworkReplyPrivate *this_00;
  pointer pQVar7;
  long lVar8;
  QHttpNetworkConnection *pQVar9;
  int in_ESI;
  QHttpNetworkConnectionChannel *in_RDI;
  long in_FS_OFFSET;
  bool connectionCloseEnabled;
  bool emitFinished;
  QHttp2ProtocolHandler *h2c;
  HttpMessagePair messagePair;
  undefined4 in_stack_ffffffffffffff48;
  ConnectionType in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  ConnectionType CVar10;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffff60;
  QHttpNetworkReply *in_stack_ffffffffffffff68;
  QHttpNetworkRequest *in_stack_ffffffffffffff70;
  QHttpNetworkConnectionPrivate *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff88;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffffa0;
  QHttp2ProtocolHandler *in_stack_ffffffffffffffa8;
  QUrl local_48 [4];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x38) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff54,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QMessageLogger::warning
              (local_28,
               "QHttpNetworkConnectionChannel::allDone() called without reply. Please report at http://bugreports.qt.io/"
              );
  }
  else {
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fa414);
    CVar10 = (ConnectionType)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    CVar4 = QHttpNetworkConnection::connectionType
                      ((QHttpNetworkConnection *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (((CVar4 == ConnectionTypeHTTP2) && (((byte)in_RDI[0x18] & 1) == 0)) &&
       (((byte)in_RDI[0x88] & 1) == 0)) {
      bVar1 = Http2::is_protocol_upgraded(in_stack_ffffffffffffff68);
      if (bVar1) {
        in_RDI[0x88] = (QHttpNetworkConnectionChannel)0x1;
        pQVar7 = std::
                 unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                 ::operator->((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                               *)0x2fa472);
        QAbstractProtocolHandler::setReply(pQVar7,(QHttpNetworkReply *)0x0);
        std::unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>::
        unique_ptr((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                    *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                    *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        QMetaObject::invokeMethod<QHttpNetworkConnectionChannel::allDone()::__0>
                  (&in_stack_ffffffffffffff68->super_QObject,
                   (anon_class_8_1_36a8a0e1_for_o *)in_stack_ffffffffffffff60,CVar10);
        allDone()::$_0::~__0((anon_class_8_1_36a8a0e1_for_o *)0x2fa4b8);
        QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fa4c9);
        QHttpNetworkConnection::fillHttp2Queue
                  ((QHttpNetworkConnection *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        obj = in_RDI + 0x78;
        operator_new(0x58);
        QHttp2ProtocolHandler::QHttp2ProtocolHandler
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        std::unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>::
        reset((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
               *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              (pointer)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        pQVar7 = std::
                 unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                 ::get((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                        *)0x2fa538);
        if (pQVar7 == (pointer)0x0) {
          CVar10 = AutoConnection;
        }
        else {
          CVar10 = (ConnectionType)((ulong)&pQVar7[-1].m_socket >> 0x20);
        }
        QMetaObject::invokeMethod<>((QObject *)obj,(char *)pQVar7,CVar10);
        QPointer::operator_cast_to_QHttpNetworkConnection_
                  ((QPointer<QHttpNetworkConnection> *)0x2fa58d);
        QMetaObject::invokeMethod<>((QObject *)obj,(char *)pQVar7,CVar10);
        goto LAB_002fa91d;
      }
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fa5b7);
      in_ESI = 0;
      QHttpNetworkConnection::setConnectionType
                ((QHttpNetworkConnection *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c);
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fa5d2);
      pQVar6 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fa5da);
      in_stack_ffffffffffffff54 = pQVar6->channelCount;
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fa5f5);
      pQVar6 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fa5fd);
      pQVar6->activeChannelCount = in_stack_ffffffffffffff54;
    }
    QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2fa617);
    bVar2 = QHttpNetworkReplyPrivate::shouldEmitSignals
                      ((QHttpNetworkReplyPrivate *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    this_00 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2fa636);
    bVar3 = QHttpNetworkReplyPrivate::isConnectionCloseEnabled(this_00);
    detectPipeliningSupport(in_stack_ffffffffffffff60);
    handleStatus((QHttpNetworkConnectionChannel *)
                 CONCAT17(bVar2,CONCAT16(bVar3,in_stack_ffffffffffffff88)));
    if ((*(long *)(in_RDI + 0x38) != 0) && ((bVar2 & 1) != 0)) {
      in_ESI = 0x3d7c24;
      QMetaObject::invokeMethod<>
                (&in_stack_ffffffffffffff68->super_QObject,(char *)in_stack_ffffffffffffff60,CVar10)
      ;
    }
    *(undefined4 *)(in_RDI + 0x5c) = 3;
    if (*(int *)(in_RDI + 0x20) != 0x10) {
      *(undefined4 *)(in_RDI + 0x20) = 0;
    }
    if (((byte)in_RDI[0x50] & 1) == 0) {
      QUrl::QUrl(local_48);
      QHttpNetworkRequest::QHttpNetworkRequest
                (in_stack_ffffffffffffff70,(QUrl *)in_stack_ffffffffffffff68,
                 (Operation)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                 (Priority)in_stack_ffffffffffffff60);
      QHttpNetworkRequest::operator=
                ((QHttpNetworkRequest *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (QHttpNetworkRequest *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      QHttpNetworkRequest::~QHttpNetworkRequest
                ((QHttpNetworkRequest *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      QUrl::~QUrl(local_48);
      *(undefined8 *)(in_RDI + 0x38) = 0;
      pQVar7 = std::
               unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
               ::operator->((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                             *)0x2fa70b);
      in_ESI = 0;
      QAbstractProtocolHandler::setReply(pQVar7,(QHttpNetworkReply *)0x0);
    }
    bVar1 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                      ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2fa728);
    if (bVar1) {
      bVar1 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                        ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2fa844);
      if ((bVar1) && (lVar8 = (**(code **)(**(long **)(in_RDI + 0x10) + 0xa0))(), 0 < lVar8)) {
        close(in_RDI,in_ESI);
        QPointer::operator_cast_to_QHttpNetworkConnection_
                  ((QPointer<QHttpNetworkConnection> *)0x2fa87d);
        QMetaObject::invokeMethod<>
                  (&in_stack_ffffffffffffff68->super_QObject,(char *)in_stack_ffffffffffffff60,
                   CVar10);
      }
      else {
        bVar1 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                          ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2fa8a7);
        if (bVar1) {
          if (((bVar3 & 1) != 0) &&
             (SVar5 = QSocketAbstraction::socketState
                                ((QIODevice *)
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)),
             SVar5 != UnconnectedState)) {
            close(in_RDI,in_ESI);
          }
          QPointer::operator_cast_to_QHttpNetworkConnection_
                    ((QPointer<QHttpNetworkConnection> *)0x2fa8e4);
          pQVar9 = qobject_cast<QHttpNetworkConnection*>((QObject *)0x2fa8ec);
          if (pQVar9 != (QHttpNetworkConnection *)0x0) {
            QPointer::operator_cast_to_QHttpNetworkConnection_
                      ((QPointer<QHttpNetworkConnection> *)0x2fa903);
            QMetaObject::invokeMethod<>
                      (&in_stack_ffffffffffffff68->super_QObject,(char *)in_stack_ffffffffffffff60,
                       CVar10);
          }
        }
      }
    }
    else if (((((byte)in_RDI[0x50] & 1) == 0) && ((bVar3 & 1) == 0)) &&
            (SVar5 = QSocketAbstraction::socketState
                               ((QIODevice *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)),
            SVar5 == ConnectedState)) {
      QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::takeFirst
                ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                 in_stack_ffffffffffffff68);
      QHttpNetworkRequest::operator=
                ((QHttpNetworkRequest *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (QHttpNetworkRequest *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      *(undefined8 *)(in_RDI + 0x38) = 0xaaaaaaaaaaaaaaaa;
      pQVar7 = std::
               unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
               ::operator->((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                             *)0x2fa7d2);
      QAbstractProtocolHandler::setReply(pQVar7,(QHttpNetworkReply *)0xaaaaaaaaaaaaaaaa);
      *(undefined4 *)(in_RDI + 0x20) = 8;
      in_RDI[0x50] = (QHttpNetworkConnectionChannel)0x0;
      *(undefined8 *)(in_RDI + 0x40) = 0;
      *(undefined8 *)(in_RDI + 0x48) = 0;
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fa80b);
      QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fa813);
      QHttpNetworkConnectionPrivate::fillPipeline
                (in_stack_ffffffffffffff78,(QIODevice *)in_stack_ffffffffffffff70);
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::~pair
                ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x2fa82e);
    }
    else {
      requeueCurrentlyPipelinedRequests(in_stack_ffffffffffffff60);
      close(in_RDI,in_ESI);
    }
  }
LAB_002fa91d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::allDone()
{
    Q_ASSERT(reply);

    if (!reply) {
        qWarning("QHttpNetworkConnectionChannel::allDone() called without reply. Please report at http://bugreports.qt.io/");
        return;
    }

    // For clear text HTTP/2 we tried to upgrade from HTTP/1.1 to HTTP/2; for
    // ConnectionTypeHTTP2Direct we can never be here in case of failure
    // (after an attempt to read HTTP/1.1 as HTTP/2 frames) or we have a normal
    // HTTP/2 response and thus can skip this test:
    if (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2
        && !ssl && !switchedToHttp2) {
        if (Http2::is_protocol_upgraded(*reply)) {
            switchedToHttp2 = true;
            protocolHandler->setReply(nullptr);

            // As allDone() gets called from the protocol handler, it's not yet
            // safe to delete it. There is no 'deleteLater', since
            // QAbstractProtocolHandler is not a QObject. Instead delete it in
            // a queued emission.

            QMetaObject::invokeMethod(this, [oldHandler = std::move(protocolHandler)]() mutable {
                oldHandler.reset();
            }, Qt::QueuedConnection);

            connection->fillHttp2Queue();
            protocolHandler.reset(new QHttp2ProtocolHandler(this));
            QHttp2ProtocolHandler *h2c = static_cast<QHttp2ProtocolHandler *>(protocolHandler.get());
            QMetaObject::invokeMethod(h2c, "_q_receiveReply", Qt::QueuedConnection);
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        } else {
            // Ok, whatever happened, we do not try HTTP/2 anymore ...
            connection->setConnectionType(QHttpNetworkConnection::ConnectionTypeHTTP);
            connection->d_func()->activeChannelCount = connection->d_func()->channelCount;
        }
    }

    // while handling 401 & 407, we might reset the status code, so save this.
    bool emitFinished = reply->d_func()->shouldEmitSignals();
    bool connectionCloseEnabled = reply->d_func()->isConnectionCloseEnabled();
    detectPipeliningSupport();

    handleStatus();
    // handleStatus() might have removed the reply because it already called connection->emitReplyError()

    // queue the finished signal, this is required since we might send new requests from
    // slot connected to it. The socket will not fire readyRead signal, if we are already
    // in the slot connected to readyRead
    if (reply && emitFinished)
        QMetaObject::invokeMethod(reply, "finished", Qt::QueuedConnection);


    // reset the reconnection attempts after we receive a complete reply.
    // in case of failures, each channel will attempt two reconnects before emitting error.
    reconnectAttempts = reconnectAttemptsDefault;

    // now the channel can be seen as free/idle again, all signal emissions for the reply have been done
    if (state != QHttpNetworkConnectionChannel::ClosingState)
        state = QHttpNetworkConnectionChannel::IdleState;

    // if it does not need to be sent again we can set it to 0
    // the previous code did not do that and we had problems with accidental re-sending of a
    // finished request.
    // Note that this may trigger a segfault at some other point. But then we can fix the underlying
    // problem.
    if (!resendCurrent) {
        request = QHttpNetworkRequest();
        reply = nullptr;
        protocolHandler->setReply(nullptr);
    }

    // move next from pipeline to current request
    if (!alreadyPipelinedRequests.isEmpty()) {
        if (resendCurrent || connectionCloseEnabled || QSocketAbstraction::socketState(socket) != QAbstractSocket::ConnectedState) {
            // move the pipelined ones back to the main queue
            requeueCurrentlyPipelinedRequests();
            close();
        } else {
            // there were requests pipelined in and we can continue
            HttpMessagePair messagePair = alreadyPipelinedRequests.takeFirst();

            request = messagePair.first;
            reply = messagePair.second;
            protocolHandler->setReply(messagePair.second);
            state = QHttpNetworkConnectionChannel::ReadingState;
            resendCurrent = false;

            written = 0; // message body, excluding the header, irrelevant here
            bytesTotal = 0; // message body total, excluding the header, irrelevant here

            // pipeline even more
            connection->d_func()->fillPipeline(socket);

            // continue reading
            //_q_receiveReply();
            // this was wrong, allDone gets called from that function anyway.
        }
    } else if (alreadyPipelinedRequests.isEmpty() && socket->bytesAvailable() > 0) {
        // this is weird. we had nothing pipelined but still bytes available. better close it.
        close();

        QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    } else if (alreadyPipelinedRequests.isEmpty()) {
        if (connectionCloseEnabled)
            if (QSocketAbstraction::socketState(socket) != QAbstractSocket::UnconnectedState)
                close();
        if (qobject_cast<QHttpNetworkConnection*>(connection))
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    }
}